

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_to_string.cpp
# Opt level: O0

wstring * __thiscall
mjs::number_to_string_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,double m)

{
  bool bVar1;
  uint uVar2;
  void *this_00;
  __rvalue_stream_extraction_t<std::__cxx11::basic_istringstream<char>,_double_&> pbVar3;
  int k_00;
  bool local_3ca;
  string local_378 [32];
  istringstream local_358 [384];
  double local_1d8;
  double t;
  ostringstream woss;
  uint local_58;
  allocator<wchar_t> local_51;
  int k;
  allocator<wchar_t> local_2d [20];
  allocator<wchar_t> local_19;
  double local_18;
  double m_local;
  
  local_18 = m;
  m_local = (double)__return_storage_ptr__;
  uVar2 = std::isnan(m);
  if ((uVar2 & 1) == 0) {
    if ((local_18 != 0.0) || (NAN(local_18))) {
      if (0.0 <= local_18) {
        uVar2 = std::isinf(local_18);
        if ((uVar2 & 1) == 0) {
          bVar1 = std::isfinite(local_18);
          if (!bVar1 || local_18 <= 0.0) {
            __assert_fail("std::isfinite(m) && m > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                          ,0x8c,"std::wstring mjs::number_to_string(double)");
          }
          local_58 = 1;
          while( true ) {
            if (0x11 < (int)local_58) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                            ,0x9a,"std::wstring mjs::number_to_string(double)");
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&t);
            std::ios_base::precision
                      ((ios_base *)((long)&t + *(long *)((long)t + -0x18)),(long)(int)local_58);
            this_00 = (void *)std::ostream::operator<<(&t,std::defaultfloat);
            std::ostream::operator<<(this_00,local_18);
            std::__cxx11::ostringstream::str();
            std::__cxx11::istringstream::istringstream(local_358,local_378,8);
            pbVar3 = std::operator>>((basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_358,&local_1d8);
            local_3ca = std::ios::operator_cast_to_bool
                                  ((ios *)(pbVar3 + *(long *)(*(long *)pbVar3 + -0x18)));
            local_3ca = local_3ca && local_1d8 == local_18;
            std::__cxx11::istringstream::~istringstream(local_358);
            std::__cxx11::string::~string(local_378);
            if (local_3ca) {
              do_format_double_abi_cxx11_
                        (__return_storage_ptr__,(mjs *)(ulong)local_58,local_18,k_00);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&t);
            if (local_3ca) break;
            local_58 = local_58 + 1;
          }
        }
        else {
          std::allocator<wchar_t>::allocator();
          std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                    ((wstring *)__return_storage_ptr__,L"Infinity",&local_51);
          std::allocator<wchar_t>::~allocator(&local_51);
        }
      }
      else {
        number_to_string_abi_cxx11_((wstring *)&k,this,-local_18);
        std::operator+(__return_storage_ptr__,L"-",(wstring *)&k);
        std::__cxx11::wstring::~wstring((wstring *)&k);
      }
    }
    else {
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                ((wstring *)__return_storage_ptr__,L"0",local_2d);
      std::allocator<wchar_t>::~allocator(local_2d);
    }
  }
  else {
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)__return_storage_ptr__,L"NaN",&local_19);
    std::allocator<wchar_t>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring number_to_string(double m) {
    // Handle special cases
    if (std::isnan(m)) {
        return L"NaN";
    }
    if (m == 0) {
        return L"0";
    }
    if (m < 0) {
        return L"-" + number_to_string(-m);
    }
    if (std::isinf(m)) {
        return L"Infinity";
    }

    assert(std::isfinite(m) && m > 0);

    // 9.8.1 ToString Applied to the Number Type    

    // Use really slow method to determine shortest representation of m
    for (int k = 1; k <= 17; ++k) {
        std::ostringstream woss;
        woss.precision(k);
        woss << std::defaultfloat << m;
        if (double t; std::istringstream{woss.str()} >> t && t == m) {
            return do_format_double(m, k);
        }
    }
    // More than 17 digits should never happen
    assert(false);
    throw std::runtime_error("Internal error");
}